

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O1

Cnf_Dat_t * Cnf_ManWriteCnfOther(Cnf_Man_t *p,Vec_Ptr_t *vMapped)

{
  char cVar1;
  int iVar2;
  void **ppvVar3;
  char *pcVar4;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  int iVar7;
  Cnf_Dat_t *pCVar8;
  int **ppiVar9;
  int *piVar10;
  int *piVar11;
  Vec_Int_t *pVVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  Aig_Man_t *pAVar17;
  int iVar18;
  size_t __size;
  int nVars;
  int iVar19;
  ulong uVar20;
  Vec_Ptr_t *pVVar21;
  int iVar22;
  long lVar23;
  int **ppiVar24;
  int iVar25;
  long lVar26;
  Vec_Int_t *pVVar27;
  int iVar28;
  ulong uVar29;
  int pVars [32];
  int local_b8 [34];
  
  pAVar17 = p->pManAig;
  iVar25 = pAVar17->nObjs[3] * 4 + 1;
  iVar28 = pAVar17->nObjs[3] * 2 + 1;
  iVar2 = vMapped->nSize;
  if (0 < (long)iVar2) {
    ppvVar3 = vMapped->pArray;
    lVar23 = 0;
    do {
      if ((*(uint *)((long)ppvVar3[lVar23] + 0x18) & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                      ,0x1b2,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
      }
      pcVar4 = *(char **)((long)ppvVar3[lVar23] + 0x28);
      cVar1 = *pcVar4;
      nVars = (int)cVar1;
      if (nVars < 5) {
        uVar29 = (ulong)p->pSopSizes[*(ushort *)(pcVar4 + (long)nVars * 4 + 0x18)];
        if ((long)uVar29 < 1) {
          iVar18 = 0;
        }
        else {
          uVar14 = 0;
          iVar18 = 0;
          do {
            iVar19 = 4;
            iVar7 = (int)p->pSops[*(ushort *)(pcVar4 + (long)nVars * 4 + 0x18)][uVar14];
            do {
              iVar18 = iVar18 + (uint)(iVar7 % 3 != 2);
              iVar19 = iVar19 + -1;
              iVar7 = iVar7 / 3;
            } while (iVar19 != 0);
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar29);
        }
        if (p->pSopSizes[*(ushort *)(pcVar4 + (long)nVars * 4 + 0x18)] < '\0') {
          __assert_fail("p->pSopSizes[uTruth] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                        ,0x1b9,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
        }
      }
      else {
        pVVar12 = *(Vec_Int_t **)(pcVar4 + 0x10);
        iVar18 = Cnf_IsopCountLiterals(pVVar12,nVars);
        uVar29 = (ulong)(uint)pVVar12->nSize;
      }
      if (cVar1 < '\x05') {
        uVar14 = (ulong)p->pSopSizes[*(ushort *)(pcVar4 + (long)nVars * 4 + 0x18) ^ 0xffff];
        if ((long)uVar14 < 1) {
          iVar7 = 0;
        }
        else {
          uVar20 = 0;
          iVar7 = 0;
          do {
            iVar22 = 4;
            iVar19 = (int)p->pSops[*(ushort *)(pcVar4 + (long)nVars * 4 + 0x18) ^ 0xffff][uVar20];
            do {
              iVar7 = iVar7 + (uint)(iVar19 % 3 != 2);
              iVar22 = iVar22 + -1;
              iVar19 = iVar19 / 3;
            } while (iVar22 != 0);
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar14);
        }
        if (p->pSopSizes[*(ushort *)(pcVar4 + (long)nVars * 4 + 0x18) ^ 0xffff] < '\0') {
          __assert_fail("p->pSopSizes[uTruth] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                        ,0x1c6,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
        }
      }
      else {
        pVVar12 = *(Vec_Int_t **)(pcVar4 + 8);
        iVar7 = Cnf_IsopCountLiterals(pVVar12,nVars);
        uVar14 = (ulong)(uint)pVVar12->nSize;
      }
      iVar28 = iVar28 + (int)uVar29 + (int)uVar14;
      iVar25 = iVar25 + iVar18 + (int)uVar29 + iVar7 + (int)uVar14;
      lVar23 = lVar23 + 1;
    } while (lVar23 != iVar2);
  }
  pCVar8 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar8->pMan = pAVar17;
  pCVar8->nLiterals = iVar25;
  pCVar8->nClauses = iVar28;
  lVar23 = (long)iVar28;
  ppiVar9 = (int **)malloc(lVar23 * 8 + 8);
  pCVar8->pClauses = ppiVar9;
  lVar26 = (long)iVar25;
  piVar10 = (int *)malloc(lVar26 * 4);
  *ppiVar9 = piVar10;
  ppiVar9[lVar23] = piVar10 + lVar26;
  pVVar21 = pAVar17->vObjs;
  __size = (long)pVVar21->nSize << 2;
  piVar10 = (int *)malloc(__size);
  pCVar8->pObj2Clause = piVar10;
  piVar11 = (int *)malloc(__size);
  pCVar8->pObj2Count = piVar11;
  iVar25 = pVVar21->nSize;
  if (0 < iVar25) {
    lVar15 = 0;
    do {
      piVar11[lVar15] = -1;
      piVar10[lVar15] = -1;
      lVar15 = lVar15 + 1;
      iVar25 = pVVar21->nSize;
    } while (lVar15 < iVar25);
  }
  pCVar8->nVars = iVar25;
  pVVar21 = pAVar17->vCis;
  if (0 < pVVar21->nSize) {
    ppvVar3 = pVVar21->pArray;
    lVar15 = 0;
    do {
      piVar11[*(int *)((long)ppvVar3[lVar15] + 0x24)] = 0;
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar21->nSize);
  }
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 0x10000;
  pVVar12->nSize = 0;
  piVar10 = (int *)malloc(0x40000);
  pVVar12->pArray = piVar10;
  piVar10 = *ppiVar9;
  if (0 < vMapped->nSize) {
    lVar15 = 0;
    do {
      pvVar5 = vMapped->pArray[lVar15];
      pCVar8->pObj2Clause[*(int *)((long)pvVar5 + 0x24)] =
           (int)((ulong)((long)ppiVar9 - (long)pCVar8->pClauses) >> 3);
      pCVar8->pObj2Count[*(int *)((long)pvVar5 + 0x24)] = 0;
      pcVar4 = *(char **)((long)pvVar5 + 0x28);
      iVar25 = *(int *)((long)pvVar5 + 0x24);
      cVar1 = *pcVar4;
      lVar13 = (long)cVar1;
      if (0 < lVar13) {
        iVar28 = p->pManAig->vObjs->nSize;
        lVar16 = 0;
        do {
          iVar2 = *(int *)(pcVar4 + lVar16 * 4 + 0x18);
          local_b8[lVar16] = iVar2;
          if (iVar28 < iVar2) {
            __assert_fail("pVars[k] <= Aig_ManObjNumMax(p->pManAig)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                          ,500,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
          }
          lVar16 = lVar16 + 1;
        } while (lVar13 != lVar16);
      }
      if (cVar1 < '\x05') {
        Cnf_SopConvertToVector
                  (p->pSops[*(ushort *)(pcVar4 + lVar13 * 4 + 0x18)],
                   (int)p->pSopSizes[*(ushort *)(pcVar4 + lVar13 * 4 + 0x18)],pVVar12);
        pVVar27 = pVVar12;
      }
      else {
        pVVar27 = *(Vec_Int_t **)(pcVar4 + 0x10);
      }
      iVar28 = pVVar27->nSize;
      if (0 < iVar28) {
        lVar13 = 0;
        lVar16 = 0;
        do {
          iVar28 = pVVar27->pArray[lVar16];
          ppiVar9[lVar16] = piVar10;
          *piVar10 = iVar25 * 2;
          iVar28 = Cnf_IsopWriteCube(iVar28,(int)*pcVar4,local_b8,piVar10 + 1);
          piVar10 = piVar10 + (long)iVar28 + 1;
          lVar16 = lVar16 + 1;
          iVar28 = pVVar27->nSize;
          lVar13 = lVar13 + 8;
        } while (lVar16 < iVar28);
        ppiVar9 = (int **)((long)ppiVar9 + lVar13);
      }
      pCVar8->pObj2Count[*(int *)((long)pvVar5 + 0x24)] =
           pCVar8->pObj2Count[*(int *)((long)pvVar5 + 0x24)] + iVar28;
      if ((long)*pcVar4 < 5) {
        Cnf_SopConvertToVector
                  (p->pSops[*(ushort *)(pcVar4 + (long)*pcVar4 * 4 + 0x18) ^ 0xffff],
                   (int)p->pSopSizes[*(ushort *)(pcVar4 + (long)*pcVar4 * 4 + 0x18) ^ 0xffff],
                   pVVar12);
        pVVar27 = pVVar12;
      }
      else {
        pVVar27 = *(Vec_Int_t **)(pcVar4 + 8);
      }
      iVar28 = pVVar27->nSize;
      if (0 < iVar28) {
        lVar13 = 0;
        lVar16 = 0;
        do {
          iVar28 = pVVar27->pArray[lVar16];
          ppiVar9[lVar16] = piVar10;
          *piVar10 = iVar25 * 2 + 1;
          iVar28 = Cnf_IsopWriteCube(iVar28,(int)*pcVar4,local_b8,piVar10 + 1);
          piVar10 = piVar10 + (long)iVar28 + 1;
          lVar16 = lVar16 + 1;
          iVar28 = pVVar27->nSize;
          lVar13 = lVar13 + 8;
        } while (lVar16 < iVar28);
        ppiVar9 = (int **)((long)ppiVar9 + lVar13);
      }
      pCVar8->pObj2Count[*(int *)((long)pvVar5 + 0x24)] =
           pCVar8->pObj2Count[*(int *)((long)pvVar5 + 0x24)] + iVar28;
      lVar15 = lVar15 + 1;
    } while (lVar15 < vMapped->nSize);
  }
  if (pVVar12->pArray != (int *)0x0) {
    free(pVVar12->pArray);
    pVVar12->pArray = (int *)0x0;
  }
  free(pVVar12);
  pAVar17 = p->pManAig;
  pVVar21 = pAVar17->vCos;
  ppiVar24 = ppiVar9;
  if (0 < pVVar21->nSize) {
    lVar15 = 0;
    do {
      pvVar5 = pVVar21->pArray[lVar15];
      pCVar8->pObj2Clause[*(int *)((long)pvVar5 + 0x24)] =
           (int)((ulong)((long)ppiVar9 - (long)pCVar8->pClauses) >> 3);
      pCVar8->pObj2Count[*(int *)((long)pvVar5 + 0x24)] = 2;
      iVar25 = *(int *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x24);
      iVar28 = *(int *)((long)pvVar5 + 0x24);
      *ppiVar24 = piVar10;
      *piVar10 = iVar28 * 2;
      piVar10[1] = (*(uint *)((long)pvVar5 + 8) & 1) + iVar25 * 2 ^ 1;
      ppiVar24[1] = piVar10 + 2;
      ppiVar24 = ppiVar24 + 2;
      piVar10[2] = iVar28 * 2 + 1;
      piVar10[3] = (*(uint *)((long)pvVar5 + 8) & 1) + iVar25 * 2;
      piVar10 = piVar10 + 4;
      lVar15 = lVar15 + 1;
      pAVar17 = p->pManAig;
      pVVar21 = pAVar17->vCos;
      ppiVar9 = ppiVar9 + 2;
    } while (lVar15 < pVVar21->nSize);
  }
  pAVar6 = pAVar17->pConst1;
  pCVar8->pObj2Clause[pAVar6->Id] = (int)((ulong)((long)ppiVar24 - (long)pCVar8->pClauses) >> 3);
  pCVar8->pObj2Count[pAVar6->Id] = 1;
  iVar25 = pAVar6->Id;
  *ppiVar24 = piVar10;
  *piVar10 = iVar25 * 2;
  if ((long)piVar10 + (4 - (long)*pCVar8->pClauses) >> 2 != lVar26) {
    __assert_fail("pLits - pCnf->pClauses[0] == nLiterals",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                  ,0x237,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
  }
  if ((long)ppiVar24 + (8 - (long)pCVar8->pClauses) >> 3 != lVar23) {
    __assert_fail("pClas - pCnf->pClauses == nClauses",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                  ,0x238,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
  }
  return pCVar8;
}

Assistant:

Cnf_Dat_t * Cnf_ManWriteCnfOther( Cnf_Man_t * p, Vec_Ptr_t * vMapped )
{
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    Cnf_Cut_t * pCut;
    Vec_Int_t * vCover, * vSopTemp;
    int OutVar, PoVar, pVars[32], * pLits, ** pClas;
    unsigned uTruth;
    int i, k, nLiterals, nClauses, Cube;

    // count the number of literals and clauses
    nLiterals = 1 + 4 * Aig_ManCoNum( p->pManAig );
    nClauses  = 1 + 2 * Aig_ManCoNum( p->pManAig );
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        pCut = Cnf_ObjBestCut( pObj );
        // positive polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            nLiterals += Cnf_SopCountLiterals( p->pSops[uTruth], p->pSopSizes[uTruth] ) + p->pSopSizes[uTruth];
            assert( p->pSopSizes[uTruth] >= 0 );
            nClauses += p->pSopSizes[uTruth];
        }
        else
        {
            nLiterals += Cnf_IsopCountLiterals( pCut->vIsop[1], pCut->nFanins ) + Vec_IntSize(pCut->vIsop[1]);
            nClauses += Vec_IntSize(pCut->vIsop[1]);
        }
        // negative polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & ~*Cnf_CutTruth(pCut);
            nLiterals += Cnf_SopCountLiterals( p->pSops[uTruth], p->pSopSizes[uTruth] ) + p->pSopSizes[uTruth];
            assert( p->pSopSizes[uTruth] >= 0 );
            nClauses += p->pSopSizes[uTruth];
        }
        else
        {
            nLiterals += Cnf_IsopCountLiterals( pCut->vIsop[0], pCut->nFanins ) + Vec_IntSize(pCut->vIsop[0]);
            nClauses += Vec_IntSize(pCut->vIsop[0]);
        }
    }

    // allocate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = p->pManAig;
    pCnf->nLiterals = nLiterals;
    pCnf->nClauses  = nClauses;
    pCnf->pClauses  = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;
    // create room for variable numbers
    pCnf->pObj2Clause = ABC_ALLOC( int, Aig_ManObjNumMax(p->pManAig) );
    pCnf->pObj2Count  = ABC_ALLOC( int, Aig_ManObjNumMax(p->pManAig) );
    for ( i = 0; i < Aig_ManObjNumMax(p->pManAig); i++ )
        pCnf->pObj2Clause[i] = pCnf->pObj2Count[i] = -1;
    pCnf->nVars = Aig_ManObjNumMax(p->pManAig);

    // clear the PI counters
    Aig_ManForEachCi( p->pManAig, pObj, i )
        pCnf->pObj2Count[pObj->Id] = 0;

    // assign the clauses
    vSopTemp = Vec_IntAlloc( 1 << 16 );
    pLits = pCnf->pClauses[0];
    pClas = pCnf->pClauses;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        // remember the starting clause
        pCnf->pObj2Clause[pObj->Id] = pClas - pCnf->pClauses;
        pCnf->pObj2Count[pObj->Id] = 0;

        // get the best cut
        pCut = Cnf_ObjBestCut( pObj );
        // save variables of this cut
        OutVar = pObj->Id;
        for ( k = 0; k < (int)pCut->nFanins; k++ )
        {
            pVars[k] = pCut->pFanins[k];
            assert( pVars[k] <= Aig_ManObjNumMax(p->pManAig) );
        }

        // positive polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vSopTemp );
            vCover = vSopTemp;
        }
        else
            vCover = pCut->vIsop[1];
        Vec_IntForEachEntry( vCover, Cube, k )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar; 
            pLits += Cnf_IsopWriteCube( Cube, pCut->nFanins, pVars, pLits );
        }
        pCnf->pObj2Count[pObj->Id] += Vec_IntSize(vCover);

        // negative polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & ~*Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vSopTemp );
            vCover = vSopTemp;
        }
        else
            vCover = pCut->vIsop[0];
        Vec_IntForEachEntry( vCover, Cube, k )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar + 1; 
            pLits += Cnf_IsopWriteCube( Cube, pCut->nFanins, pVars, pLits );
        }
        pCnf->pObj2Count[pObj->Id] += Vec_IntSize(vCover);
    }
    Vec_IntFree( vSopTemp );

    // write the output literals
    Aig_ManForEachCo( p->pManAig, pObj, i )
    {
        // remember the starting clause
        pCnf->pObj2Clause[pObj->Id] = pClas - pCnf->pClauses;
        pCnf->pObj2Count[pObj->Id] = 2;
        // get variables
        OutVar = Aig_ObjFanin0(pObj)->Id;
        PoVar = pObj->Id;
        // first clause
        *pClas++ = pLits;
        *pLits++ = 2 * PoVar; 
        *pLits++ = 2 * OutVar + !Aig_ObjFaninC0(pObj); 
        // second clause
        *pClas++ = pLits;
        *pLits++ = 2 * PoVar + 1; 
        *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
    }
 
    // remember the starting clause
    pCnf->pObj2Clause[Aig_ManConst1(p->pManAig)->Id] = pClas - pCnf->pClauses;
    pCnf->pObj2Count[Aig_ManConst1(p->pManAig)->Id] = 1;
    // write the constant literal
    OutVar = Aig_ManConst1(p->pManAig)->Id;
    *pClas++ = pLits;
    *pLits++ = 2 * OutVar; 

    // verify that the correct number of literals and clauses was written
    assert( pLits - pCnf->pClauses[0] == nLiterals );
    assert( pClas - pCnf->pClauses == nClauses );
//Cnf_DataPrint( pCnf, 1 );
    return pCnf;
}